

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElimLeibniz.cpp
# Opt level: O0

Clause * __thiscall
Inferences::ElimLeibniz::createConclusion
          (ElimLeibniz *this,Clause *premise,Literal *newLit,Literal *posLit,Literal *negLit,
          RobSubstitution *subst)

{
  bool bVar1;
  Elem ppLVar2;
  Inference *this_00;
  Clause *pCVar3;
  Literal *in_RCX;
  Clause *in_RSI;
  Literal *in_R8;
  Literal *currAfter;
  Literal *curr;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  Literal *newLitAfter;
  RStack<Literal_*> resLits;
  StlIter *in_stack_fffffffffffffed8;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffee0;
  Clause *in_stack_fffffffffffffef0;
  Clause *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff50;
  RobSubstitution *in_stack_ffffffffffffff58;
  undefined1 local_78 [24];
  undefined1 *local_60;
  Literal *local_48;
  Literal *local_28;
  Literal *local_20;
  Clause *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_fffffffffffffee0);
  local_48 = Kernel::RobSubstitution::apply
                       (in_stack_ffffffffffffff58,(Literal *)in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff4c);
  Kernel::Clause::iterLits(in_stack_fffffffffffffef0);
  local_60 = local_78;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_fffffffffffffed8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (!bVar1) break;
    ppLVar2 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
              ::StlIter::operator*((StlIter *)0x79d1ab);
    if ((*ppLVar2 != local_20) && (*ppLVar2 != local_28)) {
      in_stack_ffffffffffffff58 =
           (RobSubstitution *)
           Kernel::RobSubstitution::apply
                     (in_stack_ffffffffffffff58,(Literal *)in_stack_ffffffffffffff50,
                      in_stack_ffffffffffffff4c);
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x79d222);
      Lib::Stack<Kernel::Literal_*>::push
                (in_stack_fffffffffffffee0,(Literal *)in_stack_fffffffffffffed8);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffee0);
  }
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
             )0x79d27b);
  Lib::Stack<Kernel::Literal_*>::push
            (in_stack_fffffffffffffee0,(Literal *)in_stack_fffffffffffffed8);
  this_00 = (Inference *)
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x79d2a3);
  Kernel::GeneratingInference1::GeneratingInference1
            ((GeneratingInference1 *)&stack0xffffffffffffff18,LEIBNIZ_ELIMINATION,local_10);
  Kernel::Inference::Inference(this_00,(GeneratingInference1 *)in_stack_fffffffffffffed8);
  pCVar3 = Kernel::Clause::fromStack
                     (in_stack_ffffffffffffff50,
                      (Inference *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff28);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            in_stack_ffffffffffffff20);
  return pCVar3;
}

Assistant:

Clause* ElimLeibniz::createConclusion(Clause* premise, Literal* newLit, 
                                      Literal* posLit, Literal* negLit, RobSubstitution& subst){
  RStack<Literal*> resLits;
  Literal* newLitAfter = subst.apply(newLit, 0);

  for(Literal* curr : premise->iterLits()) {
    if(curr!=posLit && curr!=negLit){
      Literal* currAfter = subst.apply(curr, 0);
      resLits->push(currAfter);
    }
  }
  resLits->push(newLitAfter);
  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::LEIBNIZ_ELIMINATION, premise));
}